

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

QStringList * __thiscall
QFileDialogPrivate::typedFiles(QStringList *__return_storage_ptr__,QFileDialogPrivate *this)

{
  bool bVar1;
  char cVar2;
  int i;
  undefined1 *puVar3;
  long lVar4;
  long in_FS_OFFSET;
  QDir local_120 [8];
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<QString> local_f8;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<QString> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<QString> local_78;
  QStringBuilder<QString,_QChar> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.size = 0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (QString *)0x0;
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text((QString *)&local_98,&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  bVar1 = QString::contains((QString *)&local_98,(QChar)0x22,CaseSensitive);
  if (bVar1) {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QString::split(&local_b8,&local_98,0x22,0,1);
    lVar4 = 0x10;
    for (puVar3 = (undefined1 *)0x0; puVar3 < (ulong)local_b8.size; puVar3 = puVar3 + 1) {
      if (((ulong)puVar3 & 1) != 0) {
        local_d8.d = *(Data **)((long)local_b8.ptr + lVar4 + -0x10);
        local_d8.ptr = *(char16_t **)((long)local_b8.ptr + lVar4 + -8);
        local_d8.size = *(qsizetype *)((long)&((local_b8.ptr)->d).d + lVar4);
        if ((QArrayDataPointer<QString> *)local_d8.d != (QArrayDataPointer<QString> *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&((QArrayDataPointer<QString> *)local_d8.d)->d)->d =
               *(int *)&((DataPointer *)&((QArrayDataPointer<QString> *)local_d8.d)->d)->d + 1;
          UNLOCK();
        }
        local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
        QFileDialog::directory((QFileDialog *)local_120);
        QDir::absolutePath();
        local_58.a.d.size = local_118.size;
        local_58.a.d.ptr = local_118.ptr;
        local_58.a.d.d = local_118.d;
        local_118.d = (Data *)0x0;
        local_118.ptr = (char16_t *)0x0;
        local_118.size = 0;
        local_58.b.ucs = L'/';
        QStringBuilder<QString,_QChar>::convertTo<QString>((QString *)&local_f8,&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
        QDir::~QDir(local_120);
        local_118.d = (Data *)&local_f8;
        local_118.ptr = (char16_t *)&local_d8;
        QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>
                  (&local_58.a,(QStringBuilder<const_QString_&,_const_QString_&> *)&local_118);
        cVar2 = QFile::exists((QString *)&local_58);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        if (cVar2 == '\0') {
          qt_tildeExpansion(&local_58.a,(QString *)&local_d8);
          QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,&local_58.a);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
        }
        else {
          QList<QString>::emplaceBack<QString_const&>
                    ((QList<QString> *)&local_78,(QString *)&local_d8);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      }
      lVar4 = lVar4 + 0x18;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_b8);
  }
  else {
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    QFileDialog::directory((QFileDialog *)&local_f8);
    QDir::absolutePath();
    local_58.a.d.size = local_d8.size;
    local_58.a.d.ptr = local_d8.ptr;
    local_58.a.d.d = local_d8.d;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (char16_t *)0x0;
    local_d8.size = 0;
    local_58.b.ucs = L'/';
    QStringBuilder<QString,_QChar>::convertTo<QString>((QString *)&local_b8,&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QDir::~QDir((QDir *)&local_f8);
    local_d8.d = (Data *)&local_b8;
    local_d8.ptr = (char16_t *)&local_98;
    QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
              (&local_58.a,(QStringBuilder<const_QString_&,_QString_&> *)&local_d8);
    cVar2 = QFile::exists((QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    if (cVar2 == '\0') {
      qt_tildeExpansion(&local_58.a,(QString *)&local_98);
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_78,&local_58.a);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
    }
    else {
      QList<QString>::emplaceBack<QString_const&>((QList<QString> *)&local_78,(QString *)&local_98);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_b8);
  }
  addDefaultSuffixToFiles(__return_storage_ptr__,this,(QStringList *)&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QFileDialogPrivate::typedFiles() const
{
    Q_Q(const QFileDialog);
    QStringList files;
    QString editText = lineEdit()->text();
    if (!editText.contains(u'"')) {
#ifdef Q_OS_UNIX
        const QString prefix = q->directory().absolutePath() + QDir::separator();
        if (QFile::exists(prefix + editText))
            files << editText;
        else
            files << qt_tildeExpansion(editText);
#else
        files << editText;
        Q_UNUSED(q);
#endif
    } else {
        // " is used to separate files like so: "file1" "file2" "file3" ...
        // ### need escape character for filenames with quotes (")
        QStringList tokens = editText.split(u'\"');
        for (int i=0; i<tokens.size(); ++i) {
            if ((i % 2) == 0)
                continue; // Every even token is a separator
#ifdef Q_OS_UNIX
            const QString token = tokens.at(i);
            const QString prefix = q->directory().absolutePath() + QDir::separator();
            if (QFile::exists(prefix + token))
                files << token;
            else
                files << qt_tildeExpansion(token);
#else
            files << toInternal(tokens.at(i));
#endif
        }
    }
    return addDefaultSuffixToFiles(files);
}